

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O0

void __thiscall luna::VM::CopyVarArg(VM *this,Value *a,Instruction i)

{
  Value *pVVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  Function *this_00;
  Value *pVVar7;
  Instruction in_EDX;
  Value *in_RSI;
  long *in_RDI;
  int i_2;
  int i_1;
  int expect_count;
  int vararg_count;
  int total_args;
  Value *arg;
  Function *proto;
  value_type *call;
  Value *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  int local_48;
  int local_44;
  Value *local_30;
  Value *local_18;
  
  bVar2 = std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::empty
                    ((list<luna::CallInfo,_std::allocator<luna::CallInfo>_> *)(*in_RDI + 0x48));
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!state_->calls_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/VM.cpp",
                  0x17b,"void luna::VM::CopyVarArg(Value *, Instruction)");
  }
  pvVar6 = std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::back
                     ((list<luna::CallInfo,_std::allocator<luna::CallInfo>_> *)
                      CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  bVar2 = false;
  if (pvVar6->func_ != (Value *)0x0) {
    bVar2 = (pvVar6->func_->field_0).obj_ != (GCObject *)0x0;
  }
  if (!bVar2) {
    __assert_fail("call->func_ && call->func_->closure_",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/VM.cpp",
                  0x17b,"void luna::VM::CopyVarArg(Value *, Instruction)");
  }
  this_00 = Closure::GetPrototype((pvVar6->func_->field_0).closure_);
  pVVar7 = pvVar6->func_ + 1;
  pVVar1 = pvVar6->register_;
  iVar3 = Function::FixedArgCount(this_00);
  iVar3 = (int)((long)pVVar1 - (long)pVVar7 >> 4) - iVar3;
  iVar4 = Function::FixedArgCount(this_00);
  iVar5 = Instruction::GetParamsBx(in_EDX);
  local_30 = pVVar7 + iVar4;
  if (iVar5 == -1) {
    local_18 = in_RSI;
    for (local_44 = 0; local_44 < iVar3; local_44 = local_44 + 1) {
      local_18->field_0 = local_30->field_0;
      local_18->type_ = local_30->type_;
      local_30 = local_30 + 1;
      local_18 = local_18 + 1;
    }
    Stack::SetNewTop((Stack *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
  }
  else {
    local_18 = in_RSI;
    for (local_48 = 0; local_48 < iVar3 && local_48 < iVar5; local_48 = local_48 + 1) {
      local_18->field_0 = local_30->field_0;
      local_18->type_ = local_30->type_;
      local_30 = local_30 + 1;
      local_18 = local_18 + 1;
    }
    for (; local_48 < iVar5; local_48 = local_48 + 1) {
      Value::SetNil(local_18);
      local_18 = local_18 + 1;
    }
  }
  return;
}

Assistant:

void VM::CopyVarArg(Value *a, Instruction i)
    {
        GET_CALLINFO_AND_PROTO();
        auto arg = call->func_ + 1;
        int total_args = call->register_ - arg;
        int vararg_count = total_args - proto->FixedArgCount();

        arg += proto->FixedArgCount();
        int expect_count = Instruction::GetParamsBx(i);
        if (expect_count == EXP_VALUE_COUNT_ANY)
        {
            for (int i = 0; i < vararg_count; ++i)
                *a++ = *arg++;
            state_->stack_.SetNewTop(a);
        }
        else
        {
            int i = 0;
            for (; i < vararg_count && i < expect_count; ++i)
                *a++ = *arg++;
            for (; i < expect_count; ++i, ++a)
                a->SetNil();
        }
    }